

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3sLongRunningShaderTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles3::Stress::anon_unknown_1::LongRunningShaderCase::iterate(LongRunningShaderCase *this)

{
  allocator<int> *this_00;
  int iVar1;
  code *pcVar2;
  code *pcVar3;
  bool bVar4;
  int iVar5;
  deUint32 dVar6;
  undefined4 uVar7;
  RenderContext *pRVar8;
  undefined4 extraout_var;
  size_type sVar10;
  reference pvVar11;
  float *data;
  reference pvVar12;
  RenderTarget *renderTarget;
  reference piVar13;
  reference vertexArrays_00;
  int local_1c4;
  PrimitiveList local_1a8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_190;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_188;
  iterator i;
  string local_178;
  VertexArrayBinding local_158;
  allocator<char> local_101;
  string local_100;
  VertexArrayBinding local_e0;
  undefined1 local_90 [8];
  vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> vertexArrays;
  undefined1 local_70 [8];
  vector<int,_std::allocator<int>_> iterCounts;
  allocator<tcu::Vector<float,_2>_> local_41;
  undefined1 local_40 [8];
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> positions;
  Random rnd;
  Functions *gl;
  LongRunningShaderCase *this_local;
  long lVar9;
  
  pRVar8 = gles3::Context::getRenderContext((this->super_TestCase).m_context);
  iVar5 = (*pRVar8->_vptr_RenderContext[3])();
  lVar9 = CONCAT44(extraout_var,iVar5);
  dVar6 = getSeed(this->m_params);
  de::Random::Random((Random *)
                     &positions.
                      super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,dVar6);
  iVar5 = this->m_params->numInvocations;
  std::allocator<tcu::Vector<float,_2>_>::allocator(&local_41);
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::vector
            ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)local_40,
             (long)iVar5,&local_41);
  std::allocator<tcu::Vector<float,_2>_>::~allocator(&local_41);
  if (this->m_params->iterCountType == ITERCOUNTTYPE_DYNAMIC) {
    local_1c4 = this->m_params->numInvocations;
  }
  else {
    local_1c4 = 1;
  }
  this_00 = (allocator<int> *)
            ((long)&vertexArrays.
                    super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(this_00);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_70,(long)local_1c4,this_00);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&vertexArrays.
                     super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::vector
            ((vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> *)local_90);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_100,"a_position",&local_101);
  sVar10 = std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::size
                     ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
                      local_40);
  pvVar11 = std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::operator[]
                      ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
                       local_40,0);
  data = tcu::Vector<float,_2>::getPtr(pvVar11);
  glu::va::Float(&local_e0,&local_100,2,(int)sVar10,0,data);
  std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::push_back
            ((vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> *)local_90,
             &local_e0);
  glu::VertexArrayBinding::~VertexArrayBinding(&local_e0);
  std::__cxx11::string::~string((string *)&local_100);
  std::allocator<char>::~allocator(&local_101);
  if (this->m_params->iterCountType == ITERCOUNTTYPE_DYNAMIC) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_178,"a_iterCount",(allocator<char> *)((long)&i._M_current + 7));
    sVar10 = std::vector<int,_std::allocator<int>_>::size
                       ((vector<int,_std::allocator<int>_> *)local_70);
    pvVar12 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)local_70,0);
    glu::va::Int32(&local_158,&local_178,1,(int)sVar10,0,pvVar12);
    std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::push_back
              ((vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> *)local_90
               ,&local_158);
    glu::VertexArrayBinding::~VertexArrayBinding(&local_158);
    std::__cxx11::string::~string((string *)&local_178);
    std::allocator<char>::~allocator((allocator<char> *)((long)&i._M_current + 7));
  }
  renderTarget = gles3::Context::getRenderTarget((this->super_TestCase).m_context);
  sVar10 = std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::size
                     ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
                      local_40);
  pvVar11 = std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::operator[]
                      ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
                       local_40,0);
  genPositions(renderTarget,(int)sVar10,pvVar11);
  local_188._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)local_70);
  while( true ) {
    local_190._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::end
                          ((vector<int,_std::allocator<int>_> *)local_70);
    bVar4 = __gnu_cxx::operator!=(&local_188,&local_190);
    if (!bVar4) break;
    iVar5 = de::Random::getInt((Random *)
                               &positions.
                                super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               this->m_params->minLoopIterCount,this->m_params->maxLoopIterCount);
    piVar13 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
              operator*(&local_188);
    *piVar13 = iVar5;
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_188);
  }
  pcVar2 = *(code **)(lVar9 + 0x1680);
  dVar6 = glu::ShaderProgram::getProgram(this->m_program);
  (*pcVar2)(dVar6);
  if (this->m_params->iterCountType == ITERCOUNTTYPE_UNIFORM) {
    pcVar2 = *(code **)(lVar9 + 0x14f0);
    pcVar3 = *(code **)(lVar9 + 0xb48);
    dVar6 = glu::ShaderProgram::getProgram(this->m_program);
    uVar7 = (*pcVar3)(dVar6,"u_iterCount");
    pvVar12 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)local_70,0);
    (*pcVar2)(uVar7,*pvVar12);
  }
  pRVar8 = gles3::Context::getRenderContext((this->super_TestCase).m_context);
  dVar6 = glu::ShaderProgram::getProgram(this->m_program);
  sVar10 = std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::size
                     ((vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> *)
                      local_90);
  vertexArrays_00 =
       std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::operator[]
                 ((vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> *)
                  local_90,0);
  glu::pr::Points(&local_1a8,this->m_params->numInvocations);
  glu::draw(pRVar8,dVar6,(int)sVar10,vertexArrays_00,&local_1a8,(DrawUtilCallback *)0x0);
  this->m_caseIterNdx = this->m_caseIterNdx + 1;
  iVar5 = this->m_caseIterNdx;
  iVar1 = this->m_numCaseIters;
  std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::~vector
            ((vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> *)local_90);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_70);
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::~vector
            ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)local_40);
  de::Random::~Random((Random *)
                      &positions.
                       super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return (uint)(iVar5 < iVar1);
}

Assistant:

LongRunningShaderCase::IterateResult LongRunningShaderCase::iterate (void)
{
	const glw::Functions&			gl				= m_context.getRenderContext().getFunctions();
	de::Random						rnd				(getSeed(*m_params));
	vector<Vec2>					positions		(m_params->numInvocations);
	vector<int>						iterCounts		(m_params->iterCountType == ITERCOUNTTYPE_DYNAMIC ? m_params->numInvocations : 1);
	vector<glu::VertexArrayBinding>	vertexArrays;

	vertexArrays.push_back(glu::va::Float("a_position", 2, (int)positions.size(), 0, positions[0].getPtr()));
	if (m_params->iterCountType == ITERCOUNTTYPE_DYNAMIC)
		vertexArrays.push_back(glu::va::Int32("a_iterCount", 1, (int)iterCounts.size(), 0, &iterCounts[0]));

	genPositions(m_context.getRenderTarget(), (int)positions.size(), &positions[0]);

	for (vector<int>::iterator i = iterCounts.begin(); i != iterCounts.end(); ++i)
		*i = rnd.getInt(m_params->minLoopIterCount, m_params->maxLoopIterCount);

	gl.useProgram(m_program->getProgram());

	if (m_params->iterCountType == ITERCOUNTTYPE_UNIFORM)
		gl.uniform1i(gl.getUniformLocation(m_program->getProgram(), "u_iterCount"), iterCounts[0]);

	glu::draw(m_context.getRenderContext(), m_program->getProgram(),
			  (int)vertexArrays.size(), &vertexArrays[0],
			  glu::pr::Points(m_params->numInvocations));

	m_caseIterNdx += 1;
	return (m_caseIterNdx < m_numCaseIters) ? CONTINUE : STOP;
}